

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O1

void __thiscall Assimp::XFileParser::FindNextNoneWhiteSpace(XFileParser *this)

{
  byte *pbVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  byte *pbVar5;
  bool bVar6;
  
  if (this->mIsBinaryFormat == false) {
    while( true ) {
      pbVar5 = (byte *)this->mP;
      pbVar1 = (byte *)this->mEnd;
      bVar6 = pbVar5 < pbVar1;
      if (!bVar6) break;
      bVar4 = *pbVar5;
      iVar2 = isspace((uint)bVar4);
      if (iVar2 != 0) {
        uVar3 = this->mLineNumber;
        do {
          pbVar5 = pbVar5 + 1;
          if (bVar4 == 10) {
            uVar3 = uVar3 + 1;
            this->mLineNumber = uVar3;
          }
          this->mP = (char *)pbVar5;
          bVar6 = pbVar5 < pbVar1;
          if (!bVar6) {
            return;
          }
          bVar4 = *pbVar5;
          iVar2 = isspace((uint)bVar4);
        } while (iVar2 != 0);
      }
      if (!bVar6) {
        return;
      }
      if (*pbVar5 != 0x23) {
        if (*pbVar5 != 0x2f) {
          return;
        }
        if (pbVar5[1] != 0x2f) {
          return;
        }
      }
      ReadUntilEndOfLine(this);
    }
  }
  return;
}

Assistant:

void XFileParser::FindNextNoneWhiteSpace()
{
    if( mIsBinaryFormat)
        return;

    bool running = true;
    while( running )
    {
        while( mP < mEnd && isspace( (unsigned char) *mP))
        {
            if( *mP == '\n')
                mLineNumber++;
            ++mP;
        }

        if( mP >= mEnd)
            return;

        // check if this is a comment
        if( (mP[0] == '/' && mP[1] == '/') || mP[0] == '#')
            ReadUntilEndOfLine();
        else
            break;
    }
}